

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader.cpp
# Opt level: O1

ssize_t __thiscall
diffusion::FileReader::read(FileReader *this,int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  ErrorNoData *this_00;
  vector<char,_std::allocator<char>_> *data;
  undefined4 in_register_00000034;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  cVar1 = (**(code **)*puVar2)(puVar2);
  if (cVar1 != '\0') {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)this,
               (vector<char,_std::allocator<char>_> *)puVar2[0x44]);
    std::
    deque<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::pop_front((deque<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 *)(puVar2 + 0x42));
    return (ssize_t)this;
  }
  this_00 = (ErrorNoData *)__cxa_allocate_exception(0x10);
  ErrorNoData::ErrorNoData(this_00);
  __cxa_throw(this_00,&ErrorNoData::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<char> FileReader::read() {
    if (this->can_read()) {
        std::vector<char> data(data_queue_.front());
        data_queue_.pop_front();
        return data;
    } else {
        throw ErrorNoData();
    }
}